

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

void Emb_ManTransformRefs(Gia_Man_t *p,int *pnObjs,int *pnFanios)

{
  int iVar1;
  int iVar2;
  int v;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int i;
  
  if (p->pRefs == (int *)0x0) {
    __assert_fail("p->pRefs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                  ,0x183,"void Emb_ManTransformRefs(Gia_Man_t *, int *, int *)");
  }
  Gia_ManCleanMark0(p);
  *(ulong *)p->pObjs = *(ulong *)p->pObjs | 0x40000000;
  for (iVar7 = 0; iVar7 < p->vCis->nSize; iVar7 = iVar7 + 1) {
    pGVar3 = Gia_ManCi(p,iVar7);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    pGVar3->field_0x3 = pGVar3->field_0x3 | 0x40;
  }
  for (iVar7 = 0; iVar7 < p->nObjs; iVar7 = iVar7 + 1) {
    pGVar3 = Gia_ManObj(p,iVar7);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar3 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar3) {
      iVar2 = Gia_ObjRefNum(p,pGVar3);
      *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0xffffffffbfffffff | (ulong)((uint)(1 < iVar2) << 0x1e);
    }
  }
  for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
    pGVar3 = Gia_ManCo(p,iVar7);
    *(ulong *)(pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)) =
         *(ulong *)(pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)) | 0x40000000;
  }
  iVar7 = 0;
  for (iVar2 = 0; iVar2 < p->nObjs; iVar2 = iVar2 + 1) {
    pGVar3 = Gia_ManObj(p,iVar2);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar7 = iVar7 + (uint)((*(uint *)pGVar3 >> 0x1e & 1) != 0);
  }
  *pnObjs = iVar7 + p->vCos->nSize;
  free(p->pRefs);
  piVar4 = (int *)calloc((long)p->nObjs,4);
  p->pRefs = piVar4;
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_IntAlloc(100);
  Gia_ManCleanMark1(p);
  iVar7 = 0;
  for (iVar2 = 0; iVar2 < p->nObjs; iVar2 = iVar2 + 1) {
    pGVar3 = Gia_ManObj(p,iVar2);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    if ((*(uint *)pGVar3 & 0xc0000000) == 0x40000000 && (~*(uint *)pGVar3 & 0x1fffffff) != 0) {
      Emb_ManCollectSuper(p,pGVar3,p_00,p_01);
      iVar1 = p_00->nSize;
      i = 0;
      iVar6 = 0;
      if (0 < iVar1) {
        iVar6 = iVar1;
      }
      for (; iVar6 != i; i = i + 1) {
        v = Vec_IntEntry(p_00,i);
        pGVar3 = Gia_ManObj(p,v);
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        if ((pGVar3->field_0x3 & 0x40) == 0) {
          __assert_fail("pFanin->fMark0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                        ,0x1a7,"void Emb_ManTransformRefs(Gia_Man_t *, int *, int *)");
        }
        Gia_ObjRefInc(p,pGVar3);
      }
      iVar7 = iVar7 + iVar1;
    }
  }
  Gia_ManCheckMark1(p);
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  iVar2 = 0;
  while( true ) {
    iVar1 = p->vCos->nSize;
    if (iVar1 <= iVar2) {
      *pnFanios = iVar1 + iVar7;
      return;
    }
    pGVar3 = Gia_ManCo(p,iVar2);
    uVar5 = (ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff);
    if ((pGVar3[-uVar5].field_0x3 & 0x40) == 0) break;
    Gia_ObjRefInc(p,pGVar3 + -uVar5);
    iVar2 = iVar2 + 1;
  }
  __assert_fail("pObj->fMark0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                ,0x1b2,"void Emb_ManTransformRefs(Gia_Man_t *, int *, int *)");
}

Assistant:

void Emb_ManTransformRefs( Gia_Man_t * p, int * pnObjs, int * pnFanios )  
{
    Vec_Int_t * vSuper, * vVisit;
    Gia_Obj_t * pObj, * pFanin;
    int i, k, Counter;
    assert( p->pRefs != NULL );

    // mark nodes to be used in the logic network
    Gia_ManCleanMark0( p );
    Gia_ManConst0(p)->fMark0 = 1;
    // mark the inputs
    Gia_ManForEachCi( p, pObj, i )
        pObj->fMark0 = 1;
    // mark those nodes that have ref count more than 1
    Gia_ManForEachAnd( p, pObj, i )
        pObj->fMark0 = (Gia_ObjRefNum(p, pObj) > 1);
    // mark the output drivers
    Gia_ManForEachCoDriver( p, pObj, i )
        pObj->fMark0 = 1;

    // count the number of nodes
    Counter = 0;
    Gia_ManForEachObj( p, pObj, i )
        Counter += pObj->fMark0;
    *pnObjs = Counter + Gia_ManCoNum(p);

    // reset the references
    ABC_FREE( p->pRefs );
    p->pRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    // reference from internal nodes
    Counter = 0;
    vSuper = Vec_IntAlloc( 100 );
    vVisit = Vec_IntAlloc( 100 );
    Gia_ManCleanMark1( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( pObj->fMark0 == 0 )
            continue;
        Emb_ManCollectSuper( p, pObj, vSuper, vVisit );
        Gia_ManForEachObjVec( vSuper, p, pFanin, k )
        {
            assert( pFanin->fMark0 );
            Gia_ObjRefInc( p, pFanin );
        }
        Counter += Vec_IntSize( vSuper );
    }
    Gia_ManCheckMark1( p );
    Vec_IntFree( vSuper );
    Vec_IntFree( vVisit );
    // reference from outputs
    Gia_ManForEachCoDriver( p, pObj, i )
    {
        assert( pObj->fMark0 );
        Gia_ObjRefInc( p, pObj );
    }
    *pnFanios = Counter + Gia_ManCoNum(p);
}